

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

InsertResult __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::insert
          (OrderedFixedStorage<unsigned_int,_3UL> *this,uint *x)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (this->super_FixedStorageBase<unsigned_int,_3UL>).used;
  uVar5 = *x;
  uVar3 = 0;
  do {
    uVar4 = uVar2;
    if (uVar2 == uVar3) {
LAB_00b4c064:
      if (3 < uVar2) {
        __assert_fail("this->used <= N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,99,
                      "InsertResult wasm::OrderedFixedStorage<unsigned int, 3>::insert(const T &) [T = unsigned int, N = 3]"
                     );
      }
      if (uVar2 != 3) {
        if (uVar4 != uVar2) {
          for (uVar3 = uVar2; uVar4 + 1 <= uVar3; uVar3 = uVar3 - 1) {
            (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar3] =
                 (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar3 - 1];
          }
          uVar5 = *x;
        }
        (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar4] = uVar5;
        (this->super_FixedStorageBase<unsigned_int,_3UL>).used = uVar2 + 1;
        return NoError;
      }
      return CouldNotInsert;
    }
    uVar1 = (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar3];
    if (uVar5 <= uVar1) {
      uVar4 = uVar3;
      if (uVar1 == uVar5) {
        return NoError;
      }
      goto LAB_00b4c064;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }